

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

int Gia_ManLutLevel(Gia_Man_t *p)

{
  int iVar1;
  void *__ptr;
  int *piVar2;
  bool bVar3;
  int *pLevels;
  int Level;
  int iFan;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  __ptr = calloc((long)iVar1,4);
  for (iFan = 1; iVar1 = Gia_ManObjNum(p), iFan < iVar1; iFan = iFan + 1) {
    iVar1 = Gia_ObjIsLut(p,iFan);
    if (iVar1 != 0) {
      pLevels._0_4_ = 0;
      for (Level = 0; iVar1 = Gia_ObjLutSize(p,iFan), Level < iVar1; Level = Level + 1) {
        piVar2 = Gia_ObjLutFanins(p,iFan);
        if ((int)pLevels < *(int *)((long)__ptr + (long)piVar2[Level] * 4)) {
          pLevels._0_4_ = *(int *)((long)__ptr + (long)piVar2[Level] * 4);
        }
      }
      *(int *)((long)__ptr + (long)iFan * 4) = (int)pLevels + 1;
    }
  }
  pLevels._0_4_ = 0;
  Level = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar3 = false;
    if (Level < iVar1) {
      _k = Gia_ManCo(p,Level);
      bVar3 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjFaninId0p(p,_k);
    if ((int)pLevels < *(int *)((long)__ptr + (long)iVar1 * 4)) {
      iVar1 = Gia_ObjFaninId0p(p,_k);
      pLevels._0_4_ = *(int *)((long)__ptr + (long)iVar1 * 4);
    }
    Level = Level + 1;
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return (int)pLevels;
}

Assistant:

int Gia_ManLutLevel( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, k, iFan, Level;
    int * pLevels = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachLut( p, i )
    {
        Level = 0;
        Gia_LutForEachFanin( p, i, iFan, k )
            if ( Level < pLevels[iFan] )
                Level = pLevels[iFan];
        pLevels[i] = Level + 1;
    }
    Level = 0;
    Gia_ManForEachCo( p, pObj, k )
        if ( Level < pLevels[Gia_ObjFaninId0p(p, pObj)] )
            Level = pLevels[Gia_ObjFaninId0p(p, pObj)];
    ABC_FREE( pLevels );
    return Level;
}